

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_instancenorm.cpp
# Opt level: O1

int main(void)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint64_t uVar5;
  uint uVar6;
  long lVar7;
  uint_fast16_t uVar8;
  ulong uVar9;
  bool bVar10;
  float a;
  float a_00;
  float b;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  void *ptr_1;
  Mat m;
  void *ptr;
  void *local_b0;
  undefined1 local_a8 [48];
  undefined8 local_78;
  undefined8 uStack_70;
  Mat local_68;
  
  auVar11 = _DAT_00171020;
  auVar2 = _DAT_00171010;
  g_prng_rand_state.c = 0x37;
  g_prng_rand_state.i = 0;
  g_prng_rand_state.s[0] = 0x7685dd;
  uVar5 = 0x1007685db;
  lVar7 = 0;
  iVar3 = (int)DAT_00171030;
  iVar4 = DAT_00171030._4_4_;
  do {
    auVar12._8_4_ = (int)lVar7;
    auVar12._0_8_ = lVar7;
    auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar12 = (auVar12 | auVar2) ^ auVar11;
    if (auVar12._4_4_ == iVar4 && auVar12._0_4_ < iVar3) {
      g_prng_rand_state.s[lVar7 + 1] = uVar5 - 0x7fffffff;
      g_prng_rand_state.s[lVar7 + 2] = uVar5;
    }
    lVar7 = lVar7 + 2;
    uVar5 = uVar5 + 0xfffffffe;
  } while (lVar7 != 0x40);
  lVar7 = 0;
  do {
    uVar8 = g_prng_rand_state.i;
    uVar9 = 0;
    do {
      iVar3 = (int)uVar8;
      iVar4 = (int)uVar9;
      uVar1 = uVar9 + 1;
      g_prng_rand_state.s[iVar3 + iVar4 & 0x3f] =
           g_prng_rand_state.s[iVar3 + iVar4 + 9U & 0x3f] +
           g_prng_rand_state.s[iVar3 + iVar4 + 0x28U & 0x3f];
      if (g_prng_rand_state.c != 0) break;
      bVar10 = uVar9 < 0x1ef;
      uVar9 = uVar1;
    } while (bVar10);
    bVar10 = g_prng_rand_state.c == 0;
    g_prng_rand_state.c = g_prng_rand_state.c - 1;
    if (bVar10) {
      g_prng_rand_state.c = 0x36;
    }
    lVar7 = lVar7 + 1;
    g_prng_rand_state.i = uVar8 + uVar1;
    if (lVar7 == 10000) {
      g_prng_rand_state.i = uVar8 + uVar1;
      movmskps(0x18e198,ZEXT816(0));
      local_a8._0_8_ = (void *)0x0;
      local_a8._8_4_ = 0;
      local_a8._12_4_ = 0;
      local_a8._16_4_ = 4;
      local_a8._20_4_ = 0;
      local_a8._24_4_ = 1;
      local_a8._32_16_ = ZEXT816(0x600000003) << 0x40;
      uStack_70 = 0x18;
      local_78 = 0x200000004;
      local_68.data = (void *)0x0;
      iVar3 = posix_memalign(&local_68.data,0x10,0xc4);
      if (iVar3 != 0) {
        local_68.data = (void *)0x0;
      }
      local_a8._8_8_ = (long)local_68.data + 0xc0;
      *(undefined4 *)((long)local_68.data + 0xc0) = 1;
      local_a8._0_8_ = local_68.data;
      b = auVar11._0_4_;
      Randomize((Mat *)local_a8,a,b);
      iVar3 = test_instancenorm((Mat *)local_a8,0.01);
      uVar6 = 1;
      if (iVar3 == 0) {
        movmskps(0,ZEXT816(0));
        local_68.data = (void *)0x0;
        local_68.refcount._0_4_ = 0;
        local_68.refcount._4_4_ = 0;
        local_68.elemsize._0_4_ = 4;
        local_68.elemsize._4_4_ = 0;
        local_68.elempack = 1;
        local_68.allocator = (Allocator *)0x0;
        local_68.dims = 3;
        local_68.w = 3;
        local_68.h = 3;
        local_68.c = 8;
        local_68.cstep = 0xc;
        local_b0 = (void *)0x0;
        iVar4 = posix_memalign(&local_b0,0x10,0x184);
        if (iVar4 != 0) {
          local_b0 = (void *)0x0;
        }
        local_68.refcount = (int *)((long)local_b0 + 0x180);
        *(undefined4 *)((long)local_b0 + 0x180) = 1;
        local_68.data = local_b0;
        Randomize(&local_68,a_00,b);
        iVar4 = test_instancenorm(&local_68,0.002);
        uVar6 = (uint)(iVar4 != 0);
      }
      if ((iVar3 == 0) && (local_68.refcount != (int *)0x0)) {
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount == 0) {
          if (local_68.allocator == (Allocator *)0x0) {
            if (local_68.data != (void *)0x0) {
              free(local_68.data);
            }
          }
          else {
            (**(code **)(*(long *)local_68.allocator + 0x18))();
          }
        }
      }
      if ((int *)local_a8._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_a8._8_8_ = *(int *)local_a8._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_a8._8_8_ == 0) {
          if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_a8._0_8_ != (void *)0x0) {
              free((void *)local_a8._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)local_a8._32_8_ + 0x18))();
          }
        }
      }
      return uVar6;
    }
  } while( true );
}

Assistant:

int main()
{
    SRAND(7767517);

    return 0
        || test_instancenorm_0()
        ;
}